

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O0

int Fraig_CheckTfi_rec(Fraig_Man_t *pMan,Fraig_Node_t *pNode,Fraig_Node_t *pOld)

{
  int iVar1;
  Fraig_Node_t *pOld_local;
  Fraig_Node_t *pNode_local;
  Fraig_Man_t *pMan_local;
  
  if (pNode == (Fraig_Node_t *)0x0) {
    pMan_local._4_4_ = 0;
  }
  else if ((pNode->Num < pOld->Num) && (pMan->fChoicing == 0)) {
    pMan_local._4_4_ = 0;
  }
  else if (pNode == pOld) {
    pMan_local._4_4_ = 1;
  }
  else if (pNode->TravId == pMan->nTravIds) {
    pMan_local._4_4_ = 0;
  }
  else {
    pNode->TravId = pMan->nTravIds;
    iVar1 = Fraig_CheckTfi_rec(pMan,(Fraig_Node_t *)((ulong)pNode->p1 & 0xfffffffffffffffe),pOld);
    if (iVar1 == 0) {
      iVar1 = Fraig_CheckTfi_rec(pMan,(Fraig_Node_t *)((ulong)pNode->p2 & 0xfffffffffffffffe),pOld);
      if (iVar1 == 0) {
        pMan_local._4_4_ = Fraig_CheckTfi_rec(pMan,pNode->pNextE,pOld);
      }
      else {
        pMan_local._4_4_ = 1;
      }
    }
    else {
      pMan_local._4_4_ = 1;
    }
  }
  return pMan_local._4_4_;
}

Assistant:

int Fraig_CheckTfi_rec( Fraig_Man_t * pMan, Fraig_Node_t * pNode, Fraig_Node_t * pOld )
{
    // check the trivial cases
    if ( pNode == NULL )
        return 0;
    if ( pNode->Num < pOld->Num && !pMan->fChoicing )
        return 0;
    if ( pNode == pOld )
        return 1;
    // skip the visited node
    if ( pNode->TravId == pMan->nTravIds )
        return 0;
    pNode->TravId = pMan->nTravIds;
    // check the children
    if ( Fraig_CheckTfi_rec( pMan, Fraig_Regular(pNode->p1), pOld ) )
        return 1;
    if ( Fraig_CheckTfi_rec( pMan, Fraig_Regular(pNode->p2), pOld ) )
        return 1;
    // check equivalent nodes
    return Fraig_CheckTfi_rec( pMan, pNode->pNextE, pOld );
}